

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

void cdef_filter_16_1_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined2 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar47 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  
  bVar11 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar4 = (long)cdef_directions_padded[(long)dir + 2][0];
  lVar8 = (long)cdef_directions_padded[(long)dir + 2][1];
  auVar24._0_2_ = (undefined2)pri_strength;
  if (block_width == 8) {
    uVar5 = pri_damping;
    if (pri_strength != 0) {
      iVar3 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar5 = pri_damping - iVar3;
      if (pri_damping < iVar3) {
        uVar5 = 0;
      }
    }
    if (0 < block_height) {
      auVar24._2_2_ = auVar24._0_2_;
      auVar24._4_2_ = auVar24._0_2_;
      auVar24._6_2_ = auVar24._0_2_;
      auVar24._8_2_ = auVar24._0_2_;
      auVar24._10_2_ = auVar24._0_2_;
      auVar24._12_2_ = auVar24._0_2_;
      auVar24._14_2_ = auVar24._0_2_;
      auVar24._16_2_ = auVar24._0_2_;
      auVar24._18_2_ = auVar24._0_2_;
      auVar24._20_2_ = auVar24._0_2_;
      auVar24._22_2_ = auVar24._0_2_;
      auVar24._24_2_ = auVar24._0_2_;
      auVar24._26_2_ = auVar24._0_2_;
      auVar24._28_2_ = auVar24._0_2_;
      auVar24._30_2_ = auVar24._0_2_;
      uVar1 = (undefined2)cdef_pri_taps[bVar11][0];
      auVar23._2_2_ = uVar1;
      auVar23._0_2_ = uVar1;
      auVar23._4_2_ = uVar1;
      auVar23._6_2_ = uVar1;
      auVar23._8_2_ = uVar1;
      auVar23._10_2_ = uVar1;
      auVar23._12_2_ = uVar1;
      auVar23._14_2_ = uVar1;
      auVar23._16_2_ = uVar1;
      auVar23._18_2_ = uVar1;
      auVar23._20_2_ = uVar1;
      auVar23._22_2_ = uVar1;
      auVar23._24_2_ = uVar1;
      auVar23._26_2_ = uVar1;
      auVar23._28_2_ = uVar1;
      auVar23._30_2_ = uVar1;
      uVar1 = (undefined2)cdef_pri_taps[bVar11][1];
      auVar12._2_2_ = uVar1;
      auVar12._0_2_ = uVar1;
      auVar12._4_2_ = uVar1;
      auVar12._6_2_ = uVar1;
      auVar12._8_2_ = uVar1;
      auVar12._10_2_ = uVar1;
      auVar12._12_2_ = uVar1;
      auVar12._14_2_ = uVar1;
      auVar12._16_2_ = uVar1;
      auVar12._18_2_ = uVar1;
      auVar12._20_2_ = uVar1;
      auVar12._22_2_ = uVar1;
      auVar12._24_2_ = uVar1;
      auVar12._26_2_ = uVar1;
      auVar12._28_2_ = uVar1;
      auVar12._30_2_ = uVar1;
      uVar6 = 0;
      auVar14._8_2_ = 8;
      auVar14._0_8_ = 0x8000800080008;
      auVar14._10_2_ = 8;
      auVar14._12_2_ = 8;
      auVar14._14_2_ = 8;
      auVar14._16_2_ = 8;
      auVar14._18_2_ = 8;
      auVar14._20_2_ = 8;
      auVar14._22_2_ = 8;
      auVar14._24_2_ = 8;
      auVar14._26_2_ = 8;
      auVar14._28_2_ = 8;
      auVar14._30_2_ = 8;
      do {
        auVar16._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])in +
             ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
        auVar16._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])in;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar4 * 2));
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar4 * 2));
        auVar21._16_16_ = auVar15;
        auVar21._0_16_ = auVar18;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar4 * -2));
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar4 * -2 + 0x120));
        auVar30._16_16_ = auVar15;
        auVar30._0_16_ = auVar18;
        auVar22 = vpsubw_avx2(auVar21,auVar16);
        auVar40 = vpsraw_avx2(auVar22,0xf);
        auVar22 = vpabsw_avx2(auVar22);
        auVar32 = vpsrlw_avx2(auVar22,ZEXT416(uVar5));
        auVar32 = vpsubusw_avx2(auVar24,auVar32);
        auVar22 = vpminsw_avx2(auVar32,auVar22);
        auVar32 = vpaddw_avx2(auVar40,auVar22);
        auVar22 = vpsubw_avx2(auVar30,auVar16);
        auVar41 = vpsraw_avx2(auVar22,0xf);
        auVar22 = vpabsw_avx2(auVar22);
        auVar13 = vpsrlw_avx2(auVar22,ZEXT416(uVar5));
        auVar13 = vpsubusw_avx2(auVar24,auVar13);
        auVar22 = vpminsw_avx2(auVar13,auVar22);
        auVar22 = vpaddw_avx2(auVar41,auVar22);
        auVar22 = vpaddw_avx2(auVar41 ^ auVar22,auVar40 ^ auVar32);
        auVar13 = vpmullw_avx2(auVar22,auVar23);
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar8 * 2));
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar8 * 2));
        auVar31._16_16_ = auVar15;
        auVar31._0_16_ = auVar18;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar8 * -2));
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar8 * -2 + 0x120));
        auVar42._16_16_ = auVar15;
        auVar42._0_16_ = auVar18;
        auVar40 = vpsubw_avx2(auVar31,auVar16);
        auVar22 = vpabsw_avx2(auVar40);
        auVar32 = vpsrlw_avx2(auVar22,ZEXT416(uVar5));
        auVar41 = vpsraw_avx2(auVar40,0xf);
        auVar32 = vpsubusw_avx2(auVar24,auVar32);
        auVar22 = vpminsw_avx2(auVar22,auVar32);
        auVar32 = vpaddw_avx2(auVar22,auVar41);
        auVar22 = vpsubw_avx2(auVar42,auVar16);
        auVar47 = vpsraw_avx2(auVar22,0xf);
        auVar22 = vpabsw_avx2(auVar22);
        auVar40 = vpsrlw_avx2(auVar22,ZEXT416(uVar5));
        auVar40 = vpsubusw_avx2(auVar24,auVar40);
        auVar22 = vpminsw_avx2(auVar22,auVar40);
        auVar22 = vpaddw_avx2(auVar22,auVar47);
        auVar22 = vpaddw_avx2(auVar22 ^ auVar47,auVar32 ^ auVar41);
        auVar22 = vpmullw_avx2(auVar22,auVar12);
        auVar22 = vpaddw_avx2(auVar22,auVar13);
        auVar32 = vpsraw_avx2(auVar22,0xf);
        auVar22 = vpaddw_avx2(auVar22,auVar14);
        auVar22 = vpaddw_avx2(auVar22,auVar32);
        auVar22 = vpsraw_avx2(auVar22,4);
        auVar22 = vpaddw_avx2(auVar22,auVar16);
        *(undefined1 (*) [16])dest = auVar22._16_16_;
        *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dest + (long)dstride * 2) =
             auVar22._0_16_;
        uVar6 = uVar6 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
      } while (uVar6 < (uint)block_height);
    }
  }
  else {
    uVar5 = pri_damping;
    if (pri_strength != 0) {
      iVar3 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar5 = pri_damping - iVar3;
      if (pri_damping < iVar3) {
        uVar5 = 0;
      }
    }
    if (0 < block_height) {
      auVar22._2_2_ = auVar24._0_2_;
      auVar22._0_2_ = auVar24._0_2_;
      auVar22._4_2_ = auVar24._0_2_;
      auVar22._6_2_ = auVar24._0_2_;
      auVar22._8_2_ = auVar24._0_2_;
      auVar22._10_2_ = auVar24._0_2_;
      auVar22._12_2_ = auVar24._0_2_;
      auVar22._14_2_ = auVar24._0_2_;
      auVar22._16_2_ = auVar24._0_2_;
      auVar22._18_2_ = auVar24._0_2_;
      auVar22._20_2_ = auVar24._0_2_;
      auVar22._22_2_ = auVar24._0_2_;
      auVar22._24_2_ = auVar24._0_2_;
      auVar22._26_2_ = auVar24._0_2_;
      auVar22._28_2_ = auVar24._0_2_;
      auVar22._30_2_ = auVar24._0_2_;
      uVar1 = (undefined2)cdef_pri_taps[bVar11][0];
      auVar32._2_2_ = uVar1;
      auVar32._0_2_ = uVar1;
      auVar32._4_2_ = uVar1;
      auVar32._6_2_ = uVar1;
      auVar32._8_2_ = uVar1;
      auVar32._10_2_ = uVar1;
      auVar32._12_2_ = uVar1;
      auVar32._14_2_ = uVar1;
      auVar32._16_2_ = uVar1;
      auVar32._18_2_ = uVar1;
      auVar32._20_2_ = uVar1;
      auVar32._22_2_ = uVar1;
      auVar32._24_2_ = uVar1;
      auVar32._26_2_ = uVar1;
      auVar32._28_2_ = uVar1;
      auVar32._30_2_ = uVar1;
      uVar1 = (undefined2)cdef_pri_taps[bVar11][1];
      auVar13._2_2_ = uVar1;
      auVar13._0_2_ = uVar1;
      auVar13._4_2_ = uVar1;
      auVar13._6_2_ = uVar1;
      auVar13._8_2_ = uVar1;
      auVar13._10_2_ = uVar1;
      auVar13._12_2_ = uVar1;
      auVar13._14_2_ = uVar1;
      auVar13._16_2_ = uVar1;
      auVar13._18_2_ = uVar1;
      auVar13._20_2_ = uVar1;
      auVar13._22_2_ = uVar1;
      auVar13._24_2_ = uVar1;
      auVar13._26_2_ = uVar1;
      auVar13._28_2_ = uVar1;
      auVar13._30_2_ = uVar1;
      lVar7 = (long)dstride;
      lVar9 = lVar8 * -2;
      lVar10 = lVar4 * -2;
      uVar6 = 0;
      auVar40._8_2_ = 8;
      auVar40._0_8_ = 0x8000800080008;
      auVar40._10_2_ = 8;
      auVar40._12_2_ = 8;
      auVar40._14_2_ = 8;
      auVar40._16_2_ = 8;
      auVar40._18_2_ = 8;
      auVar40._20_2_ = 8;
      auVar40._22_2_ = 8;
      auVar40._24_2_ = 8;
      auVar40._26_2_ = 8;
      auVar40._28_2_ = 8;
      auVar40._30_2_ = 8;
      do {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)in;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)((long)in + 0x120);
        auVar15 = vpunpcklqdq_avx(auVar18,auVar15);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)((long)in + 0x240);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)((long)in + 0x360);
        auVar18 = vpunpcklqdq_avx(auVar25,auVar19);
        auVar17._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar18;
        auVar17._16_16_ = ZEXT116(1) * auVar15;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)((long)in + lVar4 * 2);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x120);
        auVar15 = vpunpcklqdq_avx(auVar26,auVar20);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x240);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x360);
        auVar18 = vpunpcklqdq_avx(auVar34,auVar27);
        auVar41._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar18;
        auVar41._16_16_ = ZEXT116(1) * auVar15;
        auVar47 = vpsubw_avx2(auVar41,auVar17);
        auVar24 = vpabsw_avx2(auVar47);
        auVar41 = vpsrlw_avx2(auVar24,ZEXT416(uVar5));
        auVar23 = vpsraw_avx2(auVar47,0xf);
        auVar41 = vpsubusw_avx2(auVar22,auVar41);
        auVar24 = vpminsw_avx2(auVar41,auVar24);
        auVar41 = vpaddw_avx2(auVar24,auVar23);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)((long)in + lVar10);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)((long)in + lVar10 + 0x120);
        auVar15 = vpunpcklqdq_avx(auVar35,auVar28);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)((long)in + lVar10 + 0x240);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)in + lVar10 + 0x360);
        auVar18 = vpunpcklqdq_avx(auVar43,auVar36);
        auVar47._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar18;
        auVar47._16_16_ = ZEXT116(1) * auVar15;
        auVar33 = vpsubw_avx2(auVar47,auVar17);
        auVar24 = vpabsw_avx2(auVar33);
        auVar47 = vpsrlw_avx2(auVar24,ZEXT416(uVar5));
        auVar33 = vpsraw_avx2(auVar33,0xf);
        auVar47 = vpsubusw_avx2(auVar22,auVar47);
        auVar24 = vpminsw_avx2(auVar24,auVar47);
        auVar24 = vpaddw_avx2(auVar24,auVar33);
        auVar24 = vpaddw_avx2(auVar24 ^ auVar33,auVar41 ^ auVar23);
        auVar47 = vpmullw_avx2(auVar24,auVar32);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)((long)in + lVar8 * 2);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)in + lVar8 * 2 + 0x120);
        auVar15 = vpunpcklqdq_avx(auVar37,auVar29);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)in + lVar8 * 2 + 0x240);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)in + lVar8 * 2 + 0x360);
        auVar18 = vpunpcklqdq_avx(auVar44,auVar38);
        auVar33._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar18;
        auVar33._16_16_ = ZEXT116(1) * auVar15;
        auVar24 = vpsubw_avx2(auVar33,auVar17);
        auVar23 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar41 = vpsrlw_avx2(auVar24,ZEXT416(uVar5));
        auVar41 = vpsubusw_avx2(auVar22,auVar41);
        auVar24 = vpminsw_avx2(auVar41,auVar24);
        auVar41 = vpaddw_avx2(auVar23,auVar24);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)in + lVar9);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)in + lVar9 + 0x120);
        auVar15 = vpunpcklqdq_avx(auVar45,auVar39);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)((long)in + lVar9 + 0x240);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)((long)in + lVar9 + 0x360);
        auVar18 = vpunpcklqdq_avx(auVar49,auVar46);
        auVar48._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar18;
        auVar48._16_16_ = ZEXT116(1) * auVar15;
        auVar24 = vpsubw_avx2(auVar48,auVar17);
        auVar48 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar33 = vpsrlw_avx2(auVar24,ZEXT416(uVar5));
        auVar33 = vpsubusw_avx2(auVar22,auVar33);
        auVar24 = vpminsw_avx2(auVar24,auVar33);
        auVar24 = vpaddw_avx2(auVar24,auVar48);
        auVar24 = vpaddw_avx2(auVar24 ^ auVar48,auVar23 ^ auVar41);
        auVar24 = vpmullw_avx2(auVar24,auVar13);
        auVar24 = vpaddw_avx2(auVar24,auVar47);
        auVar41 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpaddw_avx2(auVar24,auVar40);
        auVar24 = vpaddw_avx2(auVar24,auVar41);
        auVar24 = vpsraw_avx2(auVar24,4);
        auVar24 = vpaddw_avx2(auVar24,auVar17);
        uVar2 = vpextrq_avx(auVar24._16_16_,1);
        *(undefined8 *)dest = uVar2;
        *(long *)((long)dest + lVar7 * 2) = auVar24._16_8_;
        uVar2 = vpextrq_avx(auVar24._0_16_,1);
        *(undefined8 *)((long)dest + lVar7 * 4) = uVar2;
        *(long *)((long)dest + lVar7 * 6) = auVar24._0_8_;
        uVar6 = uVar6 + 4;
        in = (uint16_t *)((long)in + 0x480);
        dest = (void *)((long)dest + lVar7 * 8);
      } while (uVar6 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_1)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}